

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O2

void __thiscall
cmCPackLog::Log(cmCPackLog *this,int tag,char *file,int line,char *msg,size_t length)

{
  byte bVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  long lStack_80;
  byte local_75;
  string tagString;
  
  cVar2 = this->Debug;
  tagString._M_dataplus._M_p = (pointer)&tagString.field_2;
  tagString._M_string_length = 0;
  tagString.field_2._M_local_buf[0] = '\0';
  bVar7 = this->LogOutput != (ostream *)0x0;
  bVar8 = this->LastTag != tag;
  if ((tag & 1U) != 0 && (bVar8 && bVar7)) {
    local_75 = 1;
    std::__cxx11::string::assign((char *)&tagString);
  }
  else {
    local_75 = (byte)tag & 1;
  }
  bVar9 = (tag & 8U) != 0;
  bVar6 = local_75;
  if (bVar9) {
    bVar6 = 1;
  }
  if (bVar9 && (bVar8 && bVar7)) {
    if (tagString._M_string_length != 0) {
      std::__cxx11::string::append((char *)&tagString);
    }
    bVar6 = 1;
    std::__cxx11::string::assign((char *)&tagString);
  }
  bVar9 = (tag & 0x10U) != 0;
  if (bVar9) {
    bVar6 = 1;
  }
  if (bVar9 && (bVar8 && bVar7)) {
    if (tagString._M_string_length != 0) {
      std::__cxx11::string::append((char *)&tagString);
    }
    bVar6 = 1;
    std::__cxx11::string::assign((char *)&tagString);
  }
  if ((tag & 4U) == 0) {
    bVar1 = 0;
  }
  else {
    bVar1 = this->Debug;
    if ((bool)bVar1 != false) {
      cVar2 = '\x01';
      bVar6 = 1;
    }
    if ((bool)bVar1 == true && (bVar8 && bVar7)) {
      if (tagString._M_string_length != 0) {
        std::__cxx11::string::append((char *)&tagString);
      }
      bVar1 = 1;
      std::__cxx11::string::assign((char *)&tagString);
      cVar2 = '\x01';
      bVar6 = 1;
    }
  }
  if ((tag & 2U) == 0) {
    bVar5 = 0;
  }
  else {
    bVar5 = this->Verbose;
    if ((bool)bVar5 != false) {
      bVar6 = 1;
    }
    if ((bool)bVar5 == true && (bVar8 && bVar7)) {
      if (tagString._M_string_length != 0) {
        std::__cxx11::string::append((char *)&tagString);
      }
      bVar5 = 1;
      std::__cxx11::string::assign((char *)&tagString);
      bVar6 = 1;
    }
  }
  bVar9 = this->Quiet;
  poVar3 = this->LogOutput;
  if (poVar3 != (ostream *)0x0) {
    if (bVar8 && bVar7) {
      poVar3 = std::operator<<(poVar3,"[");
      poVar3 = std::operator<<(poVar3,file);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&tagString);
      std::operator<<(poVar3,"] ");
      poVar3 = this->LogOutput;
    }
    std::ostream::write((char *)poVar3,(long)msg);
  }
  this->LastTag = tag;
  if ((bVar9 != false) || (bVar6 == 0)) goto LAB_002895d0;
  if (this->NewLine == true) {
    lVar4 = 0xd8;
    if ((((tag & 0x10U) == 0) || (lStack_80 = 0xb0, (this->ErrorPrefix)._M_string_length == 0)) &&
       (((tag & 8U) == 0 || (lStack_80 = 0x90, (this->WarningPrefix)._M_string_length == 0)))) {
      lVar4 = 0xd0;
      if ((local_75 != 0) && ((this->OutputPrefix)._M_string_length != 0)) {
        lStack_80 = 0x30;
        goto LAB_00289502;
      }
      if ((bVar5 & (this->VerbosePrefix)._M_string_length != 0) != 0) {
        lStack_80 = 0x50;
        goto LAB_00289502;
      }
      if ((bVar1 & (this->DebugPrefix)._M_string_length != 0) != 0) {
        lStack_80 = 0x70;
        goto LAB_00289502;
      }
      if ((this->Prefix)._M_string_length != 0) {
        lStack_80 = 0x10;
        goto LAB_00289502;
      }
    }
    else {
LAB_00289502:
      std::operator<<(*(ostream **)((long)&(this->super_cmObject)._vptr_cmObject + lVar4),
                      (string *)((long)&(this->super_cmObject)._vptr_cmObject + lStack_80));
    }
    if (cVar2 != '\0') {
      poVar3 = std::operator<<((&this->DefaultOutput)[(tag & 0x18U) != 0],file);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      std::operator<<(poVar3," ");
    }
  }
  if ((tag & 0x18U) == 0) {
    std::ostream::write((char *)this->DefaultOutput,(long)msg);
  }
  else {
    std::ostream::write((char *)this->DefaultError,(long)msg);
  }
  std::ostream::flush();
  if ((2 < length) || (msg[length - 1] == '\n')) {
    this->NewLine = true;
  }
  if ((tag & 0x10U) != 0) {
    cmSystemTools::s_ErrorOccured = true;
  }
LAB_002895d0:
  std::__cxx11::string::~string((string *)&tagString);
  return;
}

Assistant:

void cmCPackLog::Log(int tag, const char* file, int line,
  const char* msg, size_t length)
{
  // By default no logging
  bool display = false;

  // Display file and line number if debug
  bool useFileAndLine = this->Debug;

  bool output  = false;
  bool debug   = false;
  bool warning = false;
  bool error   = false;
  bool verbose = false;

  // When writing in file, add list of tags whenever tag changes.
  std::string tagString;
  bool needTagString = false;
  if ( this->LogOutput && this->LastTag != tag )
    {
    needTagString = true;
    }

  if ( tag & LOG_OUTPUT )
    {
    output = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( tag & LOG_WARNING )
    {
    warning = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "WARNING";
      }
    }
  if ( tag & LOG_ERROR )
    {
    error = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "ERROR";
      }
    }
  if ( tag & LOG_DEBUG && this->Debug )
    {
    debug = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "DEBUG";
      }
    useFileAndLine = true;
    }
  if ( tag & LOG_VERBOSE && this->Verbose )
    {
    verbose = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( this->Quiet )
    {
    display = false;
    }
  if ( this->LogOutput )
    {
    if ( needTagString )
      {
      *this->LogOutput << "[" << file << ":" << line << " "
        << tagString << "] ";
      }
    this->LogOutput->write(msg, length);
    }
  this->LastTag = tag;
  if ( !display )
    {
    return;
    }
  if ( this->NewLine )
    {
    if ( error && !this->ErrorPrefix.empty() )
      {
      *this->DefaultError << this->ErrorPrefix;
      }
    else if ( warning && !this->WarningPrefix.empty() )
      {
      *this->DefaultError << this->WarningPrefix;
      }
    else if ( output && !this->OutputPrefix.empty() )
      {
      *this->DefaultOutput << this->OutputPrefix;
      }
    else if ( verbose && !this->VerbosePrefix.empty() )
      {
      *this->DefaultOutput << this->VerbosePrefix;
      }
    else if ( debug && !this->DebugPrefix.empty() )
      {
      *this->DefaultOutput << this->DebugPrefix;
      }
    else if ( !this->Prefix.empty() )
      {
      *this->DefaultOutput << this->Prefix;
      }
    if ( useFileAndLine )
      {
      if ( error || warning )
        {
        *this->DefaultError << file << ":" << line << " ";
        }
      else
        {
        *this->DefaultOutput << file << ":" << line << " ";
        }
      }
    }
  if ( error || warning )
    {
    this->DefaultError->write(msg, length);
    this->DefaultError->flush();
    }
  else
    {
    this->DefaultOutput->write(msg, length);
    this->DefaultOutput->flush();
    }
  if ( msg[length-1] == '\n' || length > 2 )
    {
    this->NewLine = true;
    }

  if ( error )
    {
    cmSystemTools::SetErrorOccured();
    }
}